

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::fib_perf_test::~fib_perf_test(fib_perf_test *this)

{
  fib_perf_test *this_local;
  
  ~fib_perf_test(this);
  operator_delete(this,0x298);
  return;
}

Assistant:

void test()
      {
      ops.primitives_inlined = true;
      ops.safe_primitives = false;
      ops.standard_bindings = true;

      run("(define fib (lambda (n) (cond [(fx<? n 2) 1]  [else (fx+ (fib (fx- n 2)) (fib(fx- n 1)))]))) ");
      //run("(define fib (lambda (n) (cond [(< n 2) 1]  [else (+ (fib (- n 2)) (fib(- n 1)))]))) ");
      auto tic = std::clock();
      TEST_EQ("165580141", run("(fib 40)"));
      //TEST_EQ("165580141", run("(define fib (lambda (n) (cond [(< n 2) 1]  [else (+ (fib (- n 2)) (fib(- n 1)))]))) (fib 40)"));
      auto toc = std::clock();
      std::cout << "fibonacci: " << (toc - tic) << "ms\n";

      //ops.safe_primitives = true;
      //ops.standard_bindings = false;
      //dump("(define FIB (lambda (n) (cond [(fx<? n 2) 1]  [else (fx+ (FIB (fx- n 2)) (FIB(fx- n 1)))])))");
      //expand_and_format("(define fib (lambda (n) (cond [(< n 2) 1]  [else (+ (fib (- n 2)) (fib(- n 1)))]))) ");

      //expand_and_format("(define FIB (lambda (n) (cond [(fx<? n 2) 1]  [else (fx+ (FIB (fx- n 2)) (FIB(fx- n 1)))]))) ");
      }